

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::ShrinkAutoArray(NULLCAutoArray *arr,uint size)

{
  uint size_local;
  NULLCAutoArray *arr_local;
  
  if (arr == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else if (arr->len < size) {
    nullcThrowError("ERROR: cannot extend array");
  }
  else {
    arr->len = size;
  }
  return;
}

Assistant:

void NULLC::ShrinkAutoArray(NULLCAutoArray* arr, unsigned size)
{
	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	if(size > (unsigned)arr->len)
	{
		nullcThrowError("ERROR: cannot extend array");
		return;
	}
	arr->len = size;
}